

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_create.cpp
# Opt level: O2

KTXTexture2 __thiscall ktx::CommandCreate::createTexture(CommandCreate *this,ImageSpec *target)

{
  pointer psVar1;
  _func_int *p_Var2;
  double dVar3;
  int extraout_EAX;
  int iVar4;
  uint uVar5;
  uint uVar6;
  long in_RDX;
  undefined4 uVar7;
  string orientation;
  long local_48 [3];
  undefined8 uStack_30;
  int local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  byte bStack_1c;
  undefined1 uStack_1b;
  undefined2 uStack_1a;
  
  uVar7 = 0;
  local_28 = 0;
  uStack_24 = 0;
  uStack_20 = 0;
  bStack_1c = 0;
  uStack_1b = 0;
  uStack_1a = 0;
  local_48[2] = 0;
  uStack_30 = 0;
  local_48[0] = 0;
  local_48[1] = 0;
  if (*(uint *)(in_RDX + 0x78) !=
      *(uint *)&target[7].formatDesc.samples.
                super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __assert_fail("target.depth() == baseDepth",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_create.cpp"
                  ,0x98e,"KTXTexture2 ktx::CommandCreate::createTexture(const ImageSpec &)");
  }
  local_48[0] = (ulong)*(uint *)((long)&(target->formatDesc).extended.iccProfile.profile.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data + 0xc) << 0x20;
  psVar1 = target[7].formatDesc.samples.
           super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uStack_24 = SUB84(psVar1,0);
  uStack_20 = (undefined4)((ulong)psVar1 >> 0x20);
  bStack_1c = *(int *)((long)&target[1].formatDesc.samples.
                              super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                              ._M_impl.super__Vector_impl_data._M_start + 4) != 0 &
              *(byte *)&target[1].formatDesc.samples.
                        super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
  local_48[2] = *(undefined8 *)(in_RDX + 0x70);
  if (*(char *)((long)&(target->formatDesc).extended.iccProfile.profile.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + 8) == '\0') {
    uVar5 = *(int *)((long)&target[1].formatDesc.extended.iccProfile.profile.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data + 0x14) != 0 &
            *(byte *)&target[1].formatDesc.samples.
                      super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                      ._M_impl.super__Vector_impl_data._M_start | 2;
  }
  else {
    uVar5 = 1;
  }
  uStack_30 = CONCAT44(uVar5,*(uint *)(in_RDX + 0x78));
  if (*(char *)((long)&target[1].formatDesc.samples.
                       super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) == '\x01') {
    uStack_1b = 1;
LAB_0014b46c:
    local_28 = 1;
  }
  else {
    if (*(char *)((long)&target[1].formatDesc.samples.
                         super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 5) == '\x01') {
      dVar3 = log2(0.0);
      uVar7 = SUB84(dVar3,0);
      if (*(char *)&target[1].formatDesc.samples.
                    super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage == '\0') {
        local_28 = extraout_EAX + 1;
        goto LAB_0014b4a9;
      }
    }
    else if (*(char *)&target[1].formatDesc.samples.
                       super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage == '\0')
    goto LAB_0014b46c;
    local_28 = *(int *)((long)&target[1].formatDesc.samples.
                               super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                               ._M_impl.super__Vector_impl_data._M_finish + 4);
  }
LAB_0014b4a9:
  (this->super_Command)._vptr_Command = (_func_int **)0x0;
  iVar4 = ktxTexture2_Create(uVar7,local_48,1,this);
  if (iVar4 != 0) {
    orientation._M_dataplus._M_p = (pointer)ktxErrorString(iVar4);
    Reporter::fatal<char_const(&)[46],char_const*>
              ((Reporter *)&(target->formatDesc).basic.field_0x8,DFD_FAILURE,
               (char (*) [46])"Failed to create ktxTexture: libktx error: {}",(char **)&orientation)
    ;
  }
  p_Var2 = (this->super_Command)._vptr_Command[0x10];
  uVar5 = *(uint *)(p_Var2 + 0xc);
  uVar6 = (uint)*(byte *)(in_RDX + 1) << 8;
  *(uint *)(p_Var2 + 0xc) = uVar6 | uVar5 & 0xffff00ff;
  *(uint *)(p_Var2 + 0xc) = (uint)*(byte *)(in_RDX + 2) << 0x10 | uVar6 | uVar5 & 0xff0000ff;
  if ((*(char *)((long)&target[3].formatDesc.extended.iccProfile.profile.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data + 0xb) != '\0') ||
     (*(char *)((long)&target[3].formatDesc.extended.iccProfile.profile.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + 0xf) == '\x01')) {
    orientation._M_dataplus._M_p = (pointer)&orientation.field_2;
    orientation._M_string_length = 0;
    orientation.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::resize((ulong)&orientation);
    std::__cxx11::string::assign((char *)&orientation);
    if ((*(char *)((long)&(target->formatDesc).extended.iccProfile.profile.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data + 8) == '\0') &&
       (std::__cxx11::string::append((char *)&orientation),
       *(char *)&target[1].formatDesc.samples.
                 super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                 ._M_impl.super__Vector_impl_data._M_start == '\x01')) {
      std::__cxx11::string::append((char *)&orientation);
    }
    ktxHashList_AddKVPair
              ((this->super_Command)._vptr_Command + 10,"KTXorientation",
               (int)orientation._M_string_length + 1,orientation._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&orientation);
  }
  return (KTXTexture2)(ktxTexture2 *)this;
}

Assistant:

KTXTexture2 CommandCreate::createTexture(const ImageSpec& target) {
    ktxTextureCreateInfo createInfo;
    std::memset(&createInfo, 0, sizeof(createInfo));

    assert(target.depth() == baseDepth);

    createInfo.vkFormat = options.vkFormat;
    createInfo.numFaces = numFaces;
    createInfo.numLayers = numLayers;
    createInfo.isArray = options.layers > 0u;
    createInfo.baseWidth = target.width();
    createInfo.baseHeight = target.height();
    createInfo.baseDepth = target.depth();
    createInfo.numDimensions = options._1d ? 1 : (options.depth > 0u ? 3 : 2);

    if (options.mipmapRuntime) {
        createInfo.generateMipmaps = true;
        createInfo.numLevels = 1;
    } else {
        createInfo.generateMipmaps = false;
        if (options.mipmapGenerate) {
            const auto maxDimension = std::max(target.width(), std::max(target.height(), target.depth()));
            const auto maxLevels = log2(maxDimension) + 1;
            createInfo.numLevels = options.levels.value_or(maxLevels);
        } else {
            createInfo.numLevels = options.levels.value_or(1);
        }
    }

    KTXTexture2 texture{nullptr};
    ktx_error_code_e ret = ktxTexture2_Create(&createInfo, KTX_TEXTURE_CREATE_ALLOC_STORAGE, texture.pHandle());
    if (KTX_SUCCESS != ret)
        fatal(rc::KTX_FAILURE, "Failed to create ktxTexture: libktx error: {}", ktxErrorString(ret));

    KHR_DFDSETVAL(texture->pDfd + 1, PRIMARIES, target.format().primaries());
    KHR_DFDSETVAL(texture->pDfd + 1, TRANSFER, target.format().transfer());

    // Add KTXorientation metadata
    if (options.assignTexcoordOrigin.has_value() || options.convertTexcoordOrigin.has_value()) {
        // This code is future-proofed by supporting "right" origin and 1d
        // textures. Current imitations are enforced by CL option parsing.
        std::string orientation;
        orientation.resize(3);
        orientation = target.origin().x == ImageSpec::Origin::eLeft ? "r" : "l";
        if (!options._1d) {
            orientation += target.origin().y == ImageSpec::Origin::eTop ? "d" : "u";
            if (options.depth.has_value()) {
                orientation += target.origin().z == ImageSpec::Origin::eFront ? "i" : "o";
            }
        }

        ktxHashList_AddKVPair(&texture->kvDataHead, KTX_ORIENTATION_KEY,
                static_cast<uint32_t>(orientation.size() + 1), // +1 to include the \0
                orientation.c_str());
    }

    return texture;
}